

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

void __thiscall
caffe::EmbedParameter::SerializeWithCachedSizes(EmbedParameter *this,CodedOutputStream *output)

{
  uint uVar1;
  void *pvVar2;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 4) != 0) {
    google::protobuf::internal::WireFormatLite::WriteUInt32(1,this->num_output_,output);
  }
  if ((uVar1 & 8) != 0) {
    google::protobuf::internal::WireFormatLite::WriteUInt32(2,this->input_dim_,output);
  }
  if ((uVar1 & 0x10) != 0) {
    google::protobuf::internal::WireFormatLite::WriteBool(3,this->bias_term_,output);
  }
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (4,(MessageLite *)this->weight_filler_,output);
  }
  if ((uVar1 & 2) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (5,(MessageLite *)this->bias_filler_,output);
  }
  pvVar2 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar2 & 1) == 0) {
    return;
  }
  google::protobuf::internal::WireFormat::SerializeUnknownFields
            ((UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe),output);
  return;
}

Assistant:

void EmbedParameter::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:caffe.EmbedParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional uint32 num_output = 1;
  if (cached_has_bits & 0x00000004u) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt32(1, this->num_output(), output);
  }

  // optional uint32 input_dim = 2;
  if (cached_has_bits & 0x00000008u) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt32(2, this->input_dim(), output);
  }

  // optional bool bias_term = 3 [default = true];
  if (cached_has_bits & 0x00000010u) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(3, this->bias_term(), output);
  }

  // optional .caffe.FillerParameter weight_filler = 4;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      4, *this->weight_filler_, output);
  }

  // optional .caffe.FillerParameter bias_filler = 5;
  if (cached_has_bits & 0x00000002u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      5, *this->bias_filler_, output);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    ::google::protobuf::internal::WireFormat::SerializeUnknownFields(
        unknown_fields(), output);
  }
  // @@protoc_insertion_point(serialize_end:caffe.EmbedParameter)
}